

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O2

optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::get_address(optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *__return_storage_ptr__,
             Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  dummy_u dVar1;
  const_iterator cVar2;
  key_type local_14;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  cVar2 = std::
          _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::_Select1st<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
          ::find(&(this->addresses)._M_t,&local_14);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->addresses)._M_t._M_impl.super__Rb_tree_header) {
    dVar1 = *(dummy_u *)&cVar2._M_node[1].field_0x4;
    (__return_storage_ptr__->super_type).m_initialized = true;
    (__return_storage_ptr__->super_type).m_storage.dummy_ = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Vertex_handle> get_address(Root_vertex_handle global) const {
    boost::optional < Vertex_handle > res;
    IdAddressMapConstIterator it = addresses.find(global);
    if (it == addresses.end())
      res.reset();
    else
      res = (*it).second;
    return res;
  }